

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-split-pages.cc
# Opt level: O0

void process(char *whoami,char *infile,string *outprefix)

{
  bool bVar1;
  int iVar2;
  size_type __val;
  char *pcVar3;
  QPDFWriter local_198 [8];
  QPDFWriter outpdfw;
  QPDFPageObjectHelper local_188;
  QPDFPageDocumentHelper local_150;
  QPDF local_130 [8];
  QPDF outpdf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [8];
  string outfile;
  QPDFPageObjectHelper *page;
  iterator __end1;
  iterator __begin1;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *__range1;
  undefined1 local_a0 [4];
  int pageno;
  unsigned_long local_80;
  int local_74;
  undefined1 local_70 [4];
  int pageno_len;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_50 [8];
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages;
  QPDF local_28 [8];
  QPDF inpdf;
  string *outprefix_local;
  char *infile_local;
  char *whoami_local;
  
  _inpdf = outprefix;
  QPDF::QPDF(local_28);
  QPDF::processFile((char *)local_28,infile);
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_70,local_28);
  QPDFPageDocumentHelper::getAllPages();
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_70);
  __val = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::size(local_50);
  std::__cxx11::to_string((string *)local_a0,__val);
  local_80 = std::__cxx11::string::length();
  iVar2 = QIntC::to_int<unsigned_long>(&local_80);
  std::__cxx11::string::~string((string *)local_a0);
  __range1._4_4_ = 0;
  local_74 = iVar2;
  __end1 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::begin(local_50)
  ;
  page = (QPDFPageObjectHelper *)
         std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::end(local_50);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
                                *)&page);
    if (!bVar1) break;
    outfile.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
         ::operator*(&__end1);
    __range1._4_4_ = __range1._4_4_ + 1;
    QUtil::int_to_string_abi_cxx11_((longlong)&outpdf,__range1._4_4_);
    std::operator+(&local_108,outprefix,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outpdf);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                   &local_108,".pdf");
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&outpdf);
    QPDF::QPDF(local_130);
    QPDF::emptyPDF();
    QPDFPageDocumentHelper::QPDFPageDocumentHelper(&local_150,local_130);
    QPDFPageObjectHelper::QPDFPageObjectHelper
              (&local_188,(QPDFPageObjectHelper *)outfile.field_2._8_8_);
    QPDFPageDocumentHelper::addPage((QPDFPageObjectHelper *)&local_150,SUB81(&local_188,0));
    QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_188);
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&local_150);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    QPDFWriter::QPDFWriter(local_198,local_130,pcVar3);
    if ((static_id & 1U) != 0) {
      QPDFWriter::setStaticID(SUB81(local_198,0));
      QPDFWriter::setStreamDataMode((qpdf_stream_data_e)local_198);
    }
    QPDFWriter::write();
    QPDFWriter::~QPDFWriter(local_198);
    QPDF::~QPDF(local_130);
    std::__cxx11::string::~string((string *)local_e8);
    __gnu_cxx::
    __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
    ::operator++(&__end1);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(local_50);
  QPDF::~QPDF(local_28);
  return;
}

Assistant:

static void
process(char const* whoami, char const* infile, std::string outprefix)
{
    QPDF inpdf;
    inpdf.processFile(infile);
    std::vector<QPDFPageObjectHelper> pages = QPDFPageDocumentHelper(inpdf).getAllPages();
    int pageno_len = QIntC::to_int(std::to_string(pages.size()).length());
    int pageno = 0;
    for (auto& page: pages) {
        std::string outfile = outprefix + QUtil::int_to_string(++pageno, pageno_len) + ".pdf";
        QPDF outpdf;
        outpdf.emptyPDF();
        QPDFPageDocumentHelper(outpdf).addPage(page, false);
        QPDFWriter outpdfw(outpdf, outfile.c_str());
        if (static_id) {
            // For the test suite, uncompress streams and use static IDs.
            outpdfw.setStaticID(true); // for testing only
            outpdfw.setStreamDataMode(qpdf_s_uncompress);
        }
        outpdfw.write();
    }
}